

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LinearSpace3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,size_t primID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vfloat4 a0_1;
  vfloat4 a0;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  float fVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar22 [12];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>)
                                      .super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar7 = (uVar1 + 1) * sVar4;
  lVar8 = (uVar1 + 2) * sVar4;
  lVar6 = (uVar1 + 3) * sVar4;
  fVar16 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar7),
                          ZEXT416((uint)(fVar16 * *(float *)(pcVar3 + lVar7 + 0xc))),0x30);
  auVar11 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar8),
                          ZEXT416((uint)(fVar16 * *(float *)(pcVar3 + lVar8 + 0xc))),0x30);
  auVar12 = vsubps_avx(auVar11,auVar13);
  auVar10 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar27 = auVar10._0_4_;
  auVar28._4_12_ = ZEXT812(0) << 0x20;
  auVar28._0_4_ = fVar27;
  auVar10 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar28);
  fVar23 = auVar10._0_4_;
  fVar23 = fVar23 * 1.5 + fVar27 * -0.5 * fVar23 * fVar23 * fVar23;
  auVar10._0_4_ = auVar12._0_4_ * fVar23;
  auVar10._4_4_ = auVar12._4_4_ * fVar23;
  auVar10._8_4_ = auVar12._8_4_ * fVar23;
  auVar10._12_4_ = auVar12._12_4_ * fVar23;
  if (1e-18 < fVar27) {
    auVar12 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + uVar1 * sVar4),
                            ZEXT416((uint)(fVar16 * *(float *)(pcVar3 + uVar1 * sVar4 + 0xc))),0x30)
    ;
    auVar28 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar6),
                            ZEXT416((uint)(fVar16 * *(float *)(pcVar3 + lVar6 + 0xc))),0x30);
    auVar24._0_4_ = auVar28._0_4_ * 0.0;
    auVar24._4_4_ = auVar28._4_4_ * 0.0;
    auVar24._8_4_ = auVar28._8_4_ * 0.0;
    auVar24._12_4_ = auVar28._12_4_ * 0.0;
    auVar29._8_4_ = 0xbf000000;
    auVar29._0_8_ = 0xbf000000bf000000;
    auVar29._12_4_ = 0xbf000000;
    auVar11 = vfnmadd213ps_fma(auVar11,auVar29,auVar24);
    auVar13 = vfmadd213ps_fma(auVar13,ZEXT816(0) << 0x40,auVar11);
    auVar12 = vfmadd231ps_fma(auVar13,auVar29,auVar12);
    auVar13 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar14._0_4_ = auVar12._0_4_ * auVar11._0_4_;
    auVar14._4_4_ = auVar12._4_4_ * auVar11._4_4_;
    auVar14._8_4_ = auVar12._8_4_ * auVar11._8_4_;
    auVar14._12_4_ = auVar12._12_4_ * auVar11._12_4_;
    auVar13 = vfmsub231ps_fma(auVar14,auVar10,auVar13);
    auVar13 = vshufps_avx(auVar13,auVar13,0xc9);
  }
  else {
    auVar13 = ZEXT816(0x3f80000000000000);
    auVar10 = _DAT_01f7b700;
  }
  auVar11 = vdpps_avx(auVar13,auVar13,0x7f);
  fVar16 = auVar11._0_4_;
  if (fVar16 <= 1e-18) {
    auVar11 = vshufpd_avx(auVar10,auVar10,1);
    auVar13 = vmovshdup_avx(auVar10);
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar18._0_4_ = auVar13._0_4_ ^ 0x80000000;
    auVar22 = ZEXT812(0) << 0x20;
    auVar14 = ZEXT816(0) << 0x40;
    auVar13 = vunpckhps_avx(auVar10,auVar14);
    auVar18._4_12_ = auVar22;
    auVar28 = vshufps_avx(auVar13,auVar18,0x41);
    auVar13 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar12._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
    auVar12._8_8_ = auVar11._8_8_ ^ auVar19._8_8_;
    auVar12 = vinsertps_avx(auVar12,auVar10,0x2a);
    auVar11 = vdpps_avx(auVar12,auVar12,0x7f);
    uVar5 = vcmpps_avx512vl(auVar11,auVar13,1);
    auVar13 = vpmovm2d_avx512vl(uVar5);
    auVar13._4_4_ = auVar13._0_4_;
    auVar13._8_4_ = auVar13._0_4_;
    auVar13._12_4_ = auVar13._0_4_;
    uVar9 = vpmovd2m_avx512vl(auVar13);
    auVar13 = vpcmpeqd_avx(auVar13,auVar13);
    auVar11._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar13._4_4_;
    auVar11._0_4_ = (uint)((byte)uVar9 & 1) * auVar13._0_4_;
    auVar11._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar13._8_4_;
    auVar11._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar13._12_4_;
    auVar13 = vblendvps_avx(auVar12,auVar28,auVar11);
    auVar11 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar20._4_12_ = auVar22;
    auVar20._0_4_ = auVar11._0_4_;
    auVar12 = vrsqrt14ss_avx512f(auVar14,auVar20);
    fVar16 = auVar12._0_4_;
    fVar16 = fVar16 * 1.5 - auVar11._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
    aVar17._0_4_ = auVar13._0_4_ * fVar16;
    aVar17._4_4_ = auVar13._4_4_ * fVar16;
    aVar17._8_4_ = auVar13._8_4_ * fVar16;
    aVar17._12_4_ = auVar13._12_4_ * fVar16;
    auVar13 = vshufps_avx((undefined1  [16])aVar17,(undefined1  [16])aVar17,0xc9);
    auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar21._0_4_ = aVar17._0_4_ * auVar11._0_4_;
    auVar21._4_4_ = aVar17._4_4_ * auVar11._4_4_;
    auVar21._8_4_ = aVar17._8_4_ * auVar11._8_4_;
    auVar21._12_4_ = aVar17._12_4_ * auVar11._12_4_;
    auVar13 = vfmsub231ps_fma(auVar21,auVar10,auVar13);
    auVar11 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar31._4_12_ = auVar22;
    auVar31._0_4_ = auVar13._0_4_;
    auVar12 = vrsqrt14ss_avx512f(auVar14,auVar31);
    fVar16 = auVar12._0_4_;
    fVar16 = fVar16 * 1.5 - auVar13._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
    aVar15._0_4_ = fVar16 * auVar11._0_4_;
    aVar15._4_4_ = fVar16 * auVar11._4_4_;
    aVar15._8_4_ = fVar16 * auVar11._8_4_;
    aVar15._12_4_ = fVar16 * auVar11._12_4_;
  }
  else {
    auVar22 = SUB1612(ZEXT416(0),0) << 0x20;
    auVar12 = ZEXT416(0) << 0x40;
    auVar25._4_12_ = auVar22;
    auVar25._0_4_ = fVar16;
    auVar11 = vrsqrt14ss_avx512f(auVar12,auVar25);
    fVar23 = auVar11._0_4_;
    fVar16 = fVar23 * 1.5 - fVar16 * 0.5 * fVar23 * fVar23 * fVar23;
    aVar15._0_4_ = auVar13._0_4_ * fVar16;
    aVar15._4_4_ = auVar13._4_4_ * fVar16;
    aVar15._8_4_ = auVar13._8_4_ * fVar16;
    aVar15._12_4_ = auVar13._12_4_ * fVar16;
    auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar11 = vshufps_avx((undefined1  [16])aVar15,(undefined1  [16])aVar15,0xc9);
    auVar26._0_4_ = auVar10._0_4_ * auVar11._0_4_;
    auVar26._4_4_ = auVar10._4_4_ * auVar11._4_4_;
    auVar26._8_4_ = auVar10._8_4_ * auVar11._8_4_;
    auVar26._12_4_ = auVar10._12_4_ * auVar11._12_4_;
    auVar13 = vfmsub231ps_fma(auVar26,(undefined1  [16])aVar15,auVar13);
    auVar11 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar30._4_12_ = auVar22;
    auVar30._0_4_ = auVar13._0_4_;
    auVar12 = vrsqrt14ss_avx512f(auVar12,auVar30);
    fVar16 = auVar12._0_4_;
    fVar16 = fVar16 * 1.5 - auVar13._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
    aVar17._0_4_ = fVar16 * auVar11._0_4_;
    aVar17._4_4_ = fVar16 * auVar11._4_4_;
    aVar17._8_4_ = fVar16 * auVar11._8_4_;
    aVar17._12_4_ = fVar16 * auVar11._12_4_;
  }
  (__return_storage_ptr__->vx).field_0 = aVar17;
  (__return_storage_ptr__->vy).field_0 = aVar15;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar10;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpace(const size_t primID) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);
        
        const Curve3ff curve = getCurveScaledRadius(primID);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }